

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::Match<4u,4u>
          (TextbookBoyerMoore<char16_t> *this,Char *input,CharCount inputLength,
          CharCount *inputOffset,Char *pat,CharCount patLen,RegexStats *stats)

{
  Char CVar1;
  Char kc;
  int *piVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  Type *this_00;
  int iVar8;
  CharCount CVar9;
  uint uVar10;
  CharCount index;
  int iVar11;
  long lVar12;
  uint index_00;
  int local_38;
  uint local_34;
  int lastOcc;
  
  if (input == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xb9,"(input != 0)","input != 0");
    if (!bVar4) goto LAB_00d59667;
    *puVar7 = 0;
  }
  if (inputLength < *inputOffset) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xba,"(inputOffset <= inputLength)","inputOffset <= inputLength");
    if (!bVar4) {
LAB_00d59667:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  if (patLen <= inputLength) {
    CVar9 = *inputOffset;
    index_00 = patLen - 1;
    piVar2 = (this->goodSuffix).ptr;
    this_00 = &this->lastOccurrence;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    local_34 = inputLength - index_00;
    for (; CVar9 < local_34; CVar9 = iVar11 + CVar9) {
      while( true ) {
        CVar1 = input[CVar9 + index_00];
        uVar10 = (uint)(ushort)CVar1;
        bVar4 = MatchPatternAt<4u,4u>(uVar10,pat,index_00);
        if (bVar4) break;
        if ((ushort)CVar1 < 0x100) {
          BVar5 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                            (this_00,uVar10);
          if (BVar5 == 0) goto LAB_00d595a7;
          local_38 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                               (this_00,uVar10);
LAB_00d5953d:
          uVar10 = local_34;
          iVar8 = index_00 - local_38;
          if (iVar8 < piVar2[index_00]) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                               ,0xeb,
                               "((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex])"
                               ,
                               "(int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]"
                              );
            if (!bVar4) goto LAB_00d59667;
            *puVar7 = 0;
            iVar8 = index_00 - local_38;
          }
          CVar9 = iVar8 + CVar9;
          if (uVar10 <= CVar9) {
            return false;
          }
        }
        else {
          bVar4 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                            (this_00,(uint)(ushort)CVar1,&local_38);
          if (bVar4) goto LAB_00d5953d;
LAB_00d595a7:
          CVar9 = CVar9 + patLen;
          if (local_34 <= CVar9) {
            return false;
          }
        }
      }
      lVar12 = (ulong)(patLen - 2) << 0x20;
      index = patLen - 2;
      if ((ulong)index_00 == 0) {
LAB_00d5965d:
        *inputOffset = CVar9;
        return true;
      }
      while( true ) {
        if (stats != (RegexStats *)0x0) {
          stats->numCompares = stats->numCompares + 1;
        }
        kc = input[CVar9 + index];
        bVar4 = MatchPatternAt<4u,4u>((uint)(ushort)kc,pat,index);
        if (!bVar4) break;
        index = index - 1;
        lVar12 = lVar12 + -0x100000000;
        if ((int)index < 0) goto LAB_00d5965d;
      }
      iVar6 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::Get(this_00,kc);
      iVar8 = *(int *)((long)piVar2 + (lVar12 >> 0x1e));
      iVar11 = index - iVar6;
      if ((int)(index - iVar6) <= iVar8) {
        iVar11 = iVar8;
      }
    }
  }
  return false;
}

Assistant:

bool TextbookBoyerMoore<C>::Match
        ( const Char *const input
        , const CharCount inputLength
        , CharCount& inputOffset
        , const Char* pat
        , const CharCount patLen
#if ENABLE_REGEX_CONFIG_OPTIONS
        , RegexStats* stats
#endif
        ) const
    {

        Assert(input != 0);
        Assert(inputOffset <= inputLength);

        if (inputLength < patLen)
            return false;

        CharCount offset = inputOffset;

        const CharCount endOffset = inputLength - (patLen - 1);
        const int32* const localGoodSuffix = goodSuffix;
        const LastOccMap* const localLastOccurrence = &lastOccurrence;

        const CharCount lastPatCharIndex = (patLen - 1);

        while (offset < endOffset)
        {
            // A separate tight loop to find the last character
            while (true)
            {
                uint inputChar = Chars<Char>::CTU(input[offset + lastPatCharIndex]);
                if (MatchPatternAt<equivClassSize, lastPatCharEquivClass>(inputChar, pat, lastPatCharIndex))
                {
                    // Found a match. Break out of this loop and go to the match pattern loop
                    break;
                }
                // Negative case is more common,
                // Write the checks so that we have a super tight loop
                int lastOcc;
                if (inputChar < localLastOccurrence->GetDirectMapSize())
                {
                    if (!localLastOccurrence->IsInDirectMap(inputChar))
                    {
                        offset += patLen;
                        if (offset >= endOffset)
                        {
                            return false;
                        }
                        continue;
                    }
                    lastOcc = localLastOccurrence->GetDirectMap(inputChar);
                }
                else if (!localLastOccurrence->GetNonDirect(inputChar, lastOcc))
                {
                    offset += patLen;
                    if (offset >= endOffset)
                    {
                        return false;
                    }
                    continue;
                }
                Assert((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]);
                offset += lastPatCharIndex - lastOcc;
                if (offset >= endOffset)
                {
                    return false;
                }
            }

            // CONSIDER: we can remove this check if we stop using TextbookBoyerMoore for one char pattern
            if (lastPatCharIndex == 0)
            {
                inputOffset = offset;
                return true;
            }

            // Match the rest of the pattern
            int32 j = lastPatCharIndex - 1;
            while (true)
            {
#if ENABLE_REGEX_CONFIG_OPTIONS
                if (stats != 0)
                    stats->numCompares++;
#endif
                uint inputChar = Chars<Char>::CTU(input[offset + j]);
                if (!MatchPatternAt<equivClassSize, equivClassSize>(inputChar, pat, j))
                {
                    const int32 e = j - localLastOccurrence->Get((Char)inputChar);
                    offset += e > localGoodSuffix[j] ? e : localGoodSuffix[j];
                    break;
                }
                if (--j < 0)
                {
                    inputOffset = offset;
                    return true;
                }
            }
        }
        return false;
    }